

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

ostream * __thiscall smf::Options::print(Options *this,ostream *out)

{
  size_type sVar1;
  reference ppOVar2;
  string *psVar3;
  ostream *poVar4;
  uint local_1c;
  uint i;
  ostream *out_local;
  Options *this_local;
  
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::size
                      (&this->m_optionRegister);
    if (sVar1 <= local_1c) break;
    ppOVar2 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::
              operator[](&this->m_optionRegister,(ulong)local_1c);
    psVar3 = Option_register::getDefinition_abi_cxx11_(*ppOVar2);
    poVar4 = std::operator<<(out,(string *)psVar3);
    poVar4 = std::operator<<(poVar4,"\t");
    ppOVar2 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::
              operator[](&this->m_optionRegister,(ulong)local_1c);
    psVar3 = Option_register::getDescription_abi_cxx11_(*ppOVar2);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1c = local_1c + 1;
  }
  return out;
}

Assistant:

std::ostream& Options::print(std::ostream& out) {
   for (unsigned int i=0; i<m_optionRegister.size(); i++) {
      out << m_optionRegister[i]->getDefinition() << "\t"
           << m_optionRegister[i]->getDescription() << std::endl;
   }
   return out;
}